

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

MessageInABottle * __thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
::consume_operation::
element<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::samples(std::ostream&)::MessageInABottle>
          (consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  runtime_type<> *this_00;
  MessageInABottle *pMVar2;
  consume_operation *this_local;
  
  bVar1 = sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::consume_operation::empty((consume_operation *)this);
  if (!bVar1) {
    this_00 = sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              ::consume_operation::complete_type((consume_operation *)this);
    bVar1 = runtime_type<>::
            is<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::samples(std::ostream&)::MessageInABottle>
                      (this_00);
    if (bVar1) goto LAB_02421600;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/sp_heter_queue.h"
             ,0x48a);
LAB_02421600:
  i_control = *(LfQueueControl **)(this + 8);
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::external((Consume *)this);
  pMVar2 = (MessageInABottle *)
           detail::
           LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
           ::get_element(i_control,bVar1);
  return pMVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }